

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

char * webrtc::anon_unknown_4::FilenameFromPath(char *file)

{
  char *pcVar1;
  char *local_30;
  char *end2;
  char *end1;
  char *file_local;
  
  pcVar1 = strrchr(file,0x2f);
  local_30 = strrchr(file,0x5c);
  if ((pcVar1 != (char *)0x0) || (file_local = file, local_30 != (char *)0x0)) {
    if (local_30 < pcVar1) {
      local_30 = pcVar1;
    }
    local_30 = local_30 + 1;
    file_local = local_30;
  }
  return file_local;
}

Assistant:

const char* FilenameFromPath(const char* file) {
  const char* end1 = ::strrchr(file, '/');
  const char* end2 = ::strrchr(file, '\\');
  if (!end1 && !end2)
    return file;
  else
    return (end1 > end2) ? end1 + 1 : end2 + 1;
}